

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall
kratos::Generator::wire_interface
          (Generator *this,shared_ptr<kratos::InterfaceRef> *inst1,
          shared_ptr<kratos::InterfaceRef> *inst2)

{
  string *name;
  Generator *this_00;
  InterfaceRef *this_01;
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<kratos::Stmt> *psVar3;
  bool bVar4;
  shared_ptr<kratos::InterfaceRef> *psVar5;
  Port *var;
  UserException *pUVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __node_base *p_Var7;
  basic_string_view<char> bVar8;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string local_f8;
  string local_d8;
  shared_ptr<kratos::Stmt> local_b8;
  shared_ptr<kratos::Stmt> local_a8;
  shared_ptr<kratos::InterfaceRef> *local_98;
  string local_90;
  shared_ptr<kratos::InterfaceRef> *local_70;
  Generator *local_68;
  Generator *local_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  pointer local_48;
  pointer ppStack_40;
  
  this_00 = ((inst1->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            gen_;
  local_68 = ((inst2->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->gen_;
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &local_68->super_enable_shared_from_this<kratos::Generator>);
  local_60 = this_00;
  bVar4 = has_child_generator(this_00,(shared_ptr<kratos::Generator> *)&stack0xffffffffffffffa8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffb0);
  psVar5 = inst2;
  local_70 = inst1;
  if (!bVar4) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffa8,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &local_60->super_enable_shared_from_this<kratos::Generator>);
    bVar4 = has_child_generator(local_68,(shared_ptr<kratos::Generator> *)&stack0xffffffffffffffa8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffb0);
    psVar5 = local_70;
    inst1 = inst2;
    if (!bVar4) {
      pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
      handle_name_abi_cxx11_(&local_f8,local_68);
      handle_name_abi_cxx11_(&local_d8,local_60);
      local_58 = (element_type *)local_f8._M_dataplus._M_p;
      _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length;
      local_48 = (pointer)local_d8._M_dataplus._M_p;
      ppStack_40 = (pointer)local_d8._M_string_length;
      bVar8 = fmt::v7::to_string_view<char,_0>("{0} is not a child of {1} or vise visa");
      format_str_01.data_ = (char *)bVar8.size_;
      format_str_01.size_ = 0xdd;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&stack0xffffffffffffffa8;
      fmt::v7::detail::vformat_abi_cxx11_(&local_90,(detail *)bVar8.data_,format_str_01,args_01);
      UserException::UserException(pUVar6,&local_90);
      __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  this_01 = (inst1->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98 = inst2;
  if (this_01->gen_ == this) {
    p_Var7 = &(((psVar5->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->ports_)._M_h._M_before_begin;
    do {
      p_Var7 = p_Var7->_M_nxt;
      if (p_Var7 == (__node_base *)0x0) {
        return;
      }
      name = (string *)(p_Var7 + 1);
      bVar4 = InterfaceRef::has_var(this_01,name);
      if (bVar4) {
        var = (Port *)InterfaceRef::var(this_01,name);
      }
      else {
        bVar4 = InterfaceRef::has_port(this_01,name);
        if (!bVar4) {
          pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
          peVar1 = (local_70->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          peVar2 = (local_98->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_58 = (element_type *)(peVar1->name_)._M_dataplus._M_p;
          _Stack_50._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar1->name_)._M_string_length;
          local_48 = (pointer)(peVar2->name_)._M_dataplus._M_p;
          ppStack_40 = (pointer)(peVar2->name_)._M_string_length;
          bVar8 = fmt::v7::to_string_view<char,_0>("Unable to wire interface {0} with {1}");
          format_str.data_ = (char *)bVar8.size_;
          format_str.size_ = 0xdd;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&stack0xffffffffffffffa8;
          fmt::v7::detail::vformat_abi_cxx11_(&local_90,(detail *)bVar8.data_,format_str,args);
          UserException::UserException(pUVar6,&local_90);
          __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
        }
        var = InterfaceRef::port(this_01,name);
      }
      if (*(int *)&((Var *)p_Var7[5]._M_nxt)[1].super_IRNode._vptr_IRNode == 0) {
        Var::assign((Var *)&stack0xffffffffffffffa8,(Var *)p_Var7[5]._M_nxt);
        local_b8.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
        local_b8.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Stack_50._M_pi;
        local_58 = (element_type *)0x0;
        _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        add_stmt(this,&local_b8);
        psVar3 = &local_b8;
      }
      else {
        Var::assign((Var *)&stack0xffffffffffffffa8,&var->super_Var);
        local_a8.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
        local_a8.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Stack_50._M_pi;
        local_58 = (element_type *)0x0;
        _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        add_stmt(this,&local_a8);
        psVar3 = &local_a8;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffb0);
    } while( true );
  }
  pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
  handle_name_abi_cxx11_(&local_f8,local_68);
  handle_name_abi_cxx11_(&local_d8,local_60);
  local_58 = (element_type *)local_f8._M_dataplus._M_p;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length;
  local_48 = (pointer)local_d8._M_dataplus._M_p;
  ppStack_40 = (pointer)local_d8._M_string_length;
  bVar8 = fmt::v7::to_string_view<char,_0>("{0} is not a child of {1} or vise visa");
  format_str_00.data_ = (char *)bVar8.size_;
  format_str_00.size_ = 0xdd;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&stack0xffffffffffffffa8;
  fmt::v7::detail::vformat_abi_cxx11_(&local_90,(detail *)bVar8.data_,format_str_00,args_00);
  UserException::UserException(pUVar6,&local_90);
  __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Generator::wire_interface(const std::shared_ptr<InterfaceRef> &inst1,
                               const std::shared_ptr<InterfaceRef> &inst2) {
    // the orientation is determined by the generator reference from the interface instance
    auto *gen1 = inst1->gen();
    auto *gen2 = inst2->gen();
    InterfaceRef *parent = nullptr;
    InterfaceRef *child = nullptr;
    if (gen1->has_child_generator(gen2->shared_from_this())) {
        // gen2 is gen1's child
        // wiring gen2's ports to gen1's
        parent = inst1.get();
        child = inst2.get();
    } else if (gen2->has_child_generator(gen1->shared_from_this())) {
        parent = inst2.get();
        child = inst1.get();
    } else {
        throw UserException(::format("{0} is not a child of {1} or vise visa", gen2->handle_name(),
                                     gen1->handle_name()));
    }
    if (parent->gen() != this) {
        throw UserException(::format("{0} is not a child of {1} or vise visa", gen2->handle_name(),
                                     gen1->handle_name()));
    }

    auto const &ports = child->ports();
    for (auto const &[port_name, port] : ports) {
        Var *v = nullptr;
        if (parent->has_var(port_name)) {
            v = &parent->var(port_name);
        } else if (parent->has_port(port_name)) {
            v = &parent->port(port_name);
        }
        if (!v) {
            throw UserException(
                (::format("Unable to wire interface {0} with {1}", inst1->name(), inst2->name())));
        }
        if (port->port_direction() == PortDirection::In) {
            add_stmt(port->assign(*v));
        } else {
            add_stmt(v->assign(*port));
        }
    }
}